

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O3

void __thiscall xatlas::internal::segment::ClusteredCharts::mergeCharts(ClusteredCharts *this)

{
  Array<xatlas::internal::segment::ClusteredCharts::Chart_*> *this_00;
  Array<float> *this_01;
  Array<float> *this_02;
  Array<unsigned_int> *this_03;
  int *piVar1;
  float fVar2;
  float fVar3;
  uint32_t uVar4;
  uint8_t *puVar5;
  Chart *owner;
  Chart *chart;
  uint *puVar6;
  bool bVar7;
  bool bVar8;
  uint32_t uVar9;
  uint uVar10;
  ulong uVar11;
  char *pcVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  uint index;
  float fVar17;
  float fVar18;
  FaceEdgeIterator it;
  uint32_t newBufferSize;
  float local_98;
  FaceEdgeIterator local_70;
  ulong local_58;
  ulong local_50;
  uint32_t local_44;
  long local_40;
  ulong local_38;
  
  this_00 = &this->m_charts;
  uVar9 = (this->m_charts).m_base.size;
  local_58 = (ulong)(uVar9 - 1);
  if (-1 < (int)(uVar9 - 1)) {
    this_01 = &this->m_sharedBoundaryLengths;
    this_02 = &this->m_sharedBoundaryLengthsNoSeams;
    this_03 = &this->m_sharedBoundaryEdgeCountNoSeams;
    local_40 = local_58 + 1;
    uVar14 = local_58;
    local_44 = uVar9;
    bVar7 = false;
LAB_0011e531:
    do {
      if ((this->m_charts).m_base.size <= uVar14) goto LAB_0011eb93;
      puVar5 = (this_00->m_base).buffer;
      if (puVar5 == (uint8_t *)0x0) goto LAB_0011ebaa;
      owner = *(Chart **)(puVar5 + uVar14 * 8);
      local_50 = uVar14;
      if (owner == (Chart *)0x0) {
LAB_0011ea55:
        uVar14 = local_50 - 1;
        if (0 < (long)local_50) goto LAB_0011e531;
      }
      else {
        (this->m_sharedBoundaryLengths).m_base.size = uVar9;
        if ((this->m_sharedBoundaryLengths).m_base.capacity < uVar9) {
          ArrayBase::setArrayCapacity(&this_01->m_base,uVar9);
        }
        puVar5 = (this_01->m_base).buffer;
        if ((puVar5 != (uint8_t *)0x0) &&
           (uVar4 = (this->m_sharedBoundaryLengths).m_base.size, uVar4 != 0)) {
          memset(puVar5,0,(ulong)(uVar4 * (this->m_sharedBoundaryLengths).m_base.elementSize));
        }
        (this->m_sharedBoundaryLengthsNoSeams).m_base.size = uVar9;
        if ((this->m_sharedBoundaryLengthsNoSeams).m_base.capacity < uVar9) {
          ArrayBase::setArrayCapacity(&this_02->m_base,uVar9);
        }
        puVar5 = (this_02->m_base).buffer;
        if ((puVar5 != (uint8_t *)0x0) &&
           (uVar4 = (this->m_sharedBoundaryLengthsNoSeams).m_base.size, uVar4 != 0)) {
          memset(puVar5,0,(ulong)(uVar4 * (this->m_sharedBoundaryLengthsNoSeams).m_base.elementSize)
                );
        }
        (this->m_sharedBoundaryEdgeCountNoSeams).m_base.size = uVar9;
        if ((this->m_sharedBoundaryEdgeCountNoSeams).m_base.capacity < uVar9) {
          ArrayBase::setArrayCapacity(&this_03->m_base,uVar9);
        }
        puVar5 = (this_03->m_base).buffer;
        if ((puVar5 != (uint8_t *)0x0) &&
           (uVar9 = (this->m_sharedBoundaryEdgeCountNoSeams).m_base.size, uVar9 != 0)) {
          memset(puVar5,0,(ulong)(uVar9 * (this->m_sharedBoundaryEdgeCountNoSeams).m_base.
                                          elementSize));
        }
        local_38 = (ulong)(owner->faces).m_base.size;
        if (local_38 == 0) {
          local_98 = 0.0;
        }
        else {
          local_98 = 0.0;
          uVar14 = 0;
          do {
            if ((owner->faces).m_base.size <= uVar14) goto LAB_0011ebe0;
            puVar5 = (owner->faces).m_base.buffer;
            if (puVar5 == (uint8_t *)0x0) goto LAB_0011ebc1;
            local_70.m_face = *(uint32_t *)(puVar5 + uVar14 * 4);
            local_70.m_mesh = this->m_data->mesh;
            local_70.m_relativeEdge = 0;
            local_70.m_edge = local_70.m_face * 3;
            do {
              if ((this->m_data->edgeLengths).m_base.size <= local_70.m_edge) goto LAB_0011eb34;
              puVar5 = (this->m_data->edgeLengths).m_base.buffer;
              if (puVar5 == (uint8_t *)0x0) goto LAB_0011eb4e;
              fVar2 = *(float *)(puVar5 + (ulong)local_70.m_edge * 4);
              bVar8 = Mesh::FaceEdgeIterator::isBoundary(&local_70);
              if (bVar8) {
LAB_0011e74b:
                local_98 = local_98 + fVar2;
              }
              else {
                uVar9 = Mesh::FaceEdgeIterator::oppositeFace(&local_70);
                if ((this->m_faceCharts).m_base.size <= uVar9) goto LAB_0011eb65;
                puVar5 = (this->m_faceCharts).m_base.buffer;
                if (puVar5 == (uint8_t *)0x0) goto LAB_0011eb7c;
                uVar10 = *(uint *)(puVar5 + (ulong)uVar9 * 4);
                uVar13 = (ulong)uVar10;
                if (uVar13 == 0xffffffff) goto LAB_0011e74b;
                if ((this->m_charts).m_base.size <= uVar10) goto LAB_0011eb93;
                puVar5 = (this_00->m_base).buffer;
                if (puVar5 == (uint8_t *)0x0) goto LAB_0011ebaa;
                if (*(Chart **)(puVar5 + uVar13 * 8) != owner) {
                  bVar8 = Mesh::isSeam(local_70.m_mesh,local_70.m_edge);
                  if ((bVar8) &&
                     ((bVar8 = isNormalSeam(this,local_70.m_edge), bVar8 ||
                      (bVar8 = Mesh::isTextureSeam(local_70.m_mesh,local_70.m_edge), bVar8)))) {
                    local_98 = local_98 + fVar2;
                  }
                  else {
                    if ((this->m_sharedBoundaryLengths).m_base.size <= uVar10) goto LAB_0011eb34;
                    puVar5 = (this_01->m_base).buffer;
                    if (puVar5 == (uint8_t *)0x0) goto LAB_0011eb4e;
                    *(float *)(puVar5 + uVar13 * 4) = *(float *)(puVar5 + uVar13 * 4) + fVar2;
                  }
                  if ((this->m_sharedBoundaryLengthsNoSeams).m_base.size <= uVar10)
                  goto LAB_0011eb34;
                  puVar5 = (this_02->m_base).buffer;
                  if (puVar5 == (uint8_t *)0x0) goto LAB_0011eb4e;
                  *(float *)(puVar5 + uVar13 * 4) = fVar2 + *(float *)(puVar5 + uVar13 * 4);
                  if ((this->m_sharedBoundaryEdgeCountNoSeams).m_base.size <= uVar10)
                  goto LAB_0011ebe0;
                  puVar5 = (this_03->m_base).buffer;
                  if (puVar5 == (uint8_t *)0x0) goto LAB_0011ebc1;
                  piVar1 = (int *)(puVar5 + uVar13 * 4);
                  *piVar1 = *piVar1 + 1;
                }
              }
              if (local_70.m_relativeEdge < 3) {
                local_70.m_edge = local_70.m_edge + 1;
                local_70.m_relativeEdge = local_70.m_relativeEdge + 1;
              }
            } while (local_70.m_relativeEdge != 3);
            uVar14 = uVar14 + 1;
          } while (uVar14 != local_38);
        }
        uVar14 = local_50;
        lVar15 = local_40;
        do {
          if (lVar15 - uVar14 != 1) {
            uVar13 = lVar15 - 1;
            if ((this->m_charts).m_base.size <= uVar13) goto LAB_0011eb93;
            puVar5 = (this_00->m_base).buffer;
            if (puVar5 == (uint8_t *)0x0) goto LAB_0011ebaa;
            chart = *(Chart **)(puVar5 + lVar15 * 8 + -8);
            if (chart != (Chart *)0x0) {
              if ((this->m_sharedBoundaryLengths).m_base.size <= uVar13) goto LAB_0011eb34;
              puVar5 = (this_01->m_base).buffer;
              if (puVar5 == (uint8_t *)0x0) goto LAB_0011eb4e;
              fVar2 = *(float *)(puVar5 + lVar15 * 4 + -4);
              if ((0.0 < fVar2) &&
                 (0.5 <= (chart->basis).normal.z * (owner->basis).normal.z +
                         (chart->basis).normal.x * (owner->basis).normal.x +
                         (chart->basis).normal.y * (owner->basis).normal.y)) {
                fVar3 = (this->m_data->options).maxChartArea;
                if ((fVar3 <= 0.0) || (owner->area + chart->area <= fVar3)) {
                  fVar3 = (this->m_data->options).maxBoundaryLength;
                  uVar11 = (ulong)(this->m_sharedBoundaryLengthsNoSeams).m_base.size;
                  if (0.0 < fVar3) {
                    if (uVar11 <= uVar13) goto LAB_0011eb34;
                    puVar5 = (this_02->m_base).buffer;
                    if (puVar5 == (uint8_t *)0x0) goto LAB_0011eb4e;
                    if (fVar3 < (owner->boundaryLength + chart->boundaryLength) -
                                *(float *)(puVar5 + lVar15 * 4 + -4)) goto LAB_0011ea3b;
                  }
                  if (uVar11 <= uVar13) goto LAB_0011eb34;
                  puVar5 = (this_02->m_base).buffer;
                  if (puVar5 == (uint8_t *)0x0) goto LAB_0011eb4e;
                  fVar3 = *(float *)(puVar5 + lVar15 * 4 + -4);
                  if ((((fVar3 <= 0.0) || ((owner->faces).m_base.size < 2)) ||
                      ((chart->faces).m_base.size != 1)) || (owner->area * 0.1 < chart->area)) {
                    if ((chart->faces).m_base.size == 2) {
                      if ((this->m_sharedBoundaryEdgeCountNoSeams).m_base.size <= uVar13)
                      goto LAB_0011ebe0;
                      puVar5 = (this_03->m_base).buffer;
                      if (puVar5 == (uint8_t *)0x0) goto LAB_0011ebc1;
                      if (1 < *(uint *)(puVar5 + lVar15 * 4 + -4)) goto LAB_0011ea2c;
                    }
                    if (0.0 < fVar3) {
                      fVar17 = ABS(chart->boundaryLength);
                      fVar18 = fVar3;
                      if (fVar3 <= fVar17) {
                        fVar18 = fVar17;
                      }
                      fVar17 = 1.0;
                      if (1.0 <= fVar18) {
                        fVar17 = fVar18;
                      }
                      if (ABS(fVar3 - chart->boundaryLength) <= fVar17 * 0.0001) goto LAB_0011ea2c;
                    }
                    fVar17 = owner->boundaryLength - local_98;
                    fVar18 = 0.0;
                    if (0.0 <= fVar17) {
                      fVar18 = fVar17;
                    }
                    if ((fVar2 <= fVar18 * 0.2) && (fVar2 <= chart->boundaryLength * 0.75))
                    goto LAB_0011ea3b;
                  }
LAB_0011ea2c:
                  bVar8 = mergeChart(this,owner,chart,fVar3);
                  if (bVar8) {
                    bVar7 = true;
                    break;
                  }
                }
              }
            }
          }
LAB_0011ea3b:
          lVar16 = lVar15 + -1;
          bVar8 = 0 < lVar15;
          lVar15 = lVar16;
        } while (lVar16 != 0 && bVar8);
        uVar9 = local_44;
        if (!bVar7) goto LAB_0011ea55;
      }
      if (((int)local_58 < 0) || (bVar8 = !bVar7, uVar14 = local_58, bVar7 = false, bVar8)) break;
    } while( true );
  }
  uVar10 = (this->m_charts).m_base.size;
  if (0 < (int)uVar10) {
    index = 0;
    do {
      if (uVar10 <= index) goto LAB_0011eb93;
      puVar5 = (this_00->m_base).buffer;
      if (puVar5 == (uint8_t *)0x0) goto LAB_0011ebaa;
      puVar6 = *(uint **)(puVar5 + (ulong)index * 8);
      if (puVar6 == (uint *)0x0) {
        ArrayBase::removeAt(&this_00->m_base,index);
        uVar14 = (ulong)(this->m_faceCharts).m_base.size;
        if (uVar14 != 0) {
          puVar5 = (this->m_faceCharts).m_base.buffer;
          uVar13 = 0;
          do {
            if ((this->m_faceCharts).m_base.size <= uVar13) goto LAB_0011eb65;
            if (puVar5 == (uint8_t *)0x0) goto LAB_0011eb7c;
            uVar10 = *(uint *)(puVar5 + uVar13 * 4);
            if (uVar10 == index) {
              __assert_fail("m_faceCharts[i] != c",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                            ,0x15ec,"void xatlas::internal::segment::ClusteredCharts::mergeCharts()"
                           );
            }
            if ((int)(this->m_charts).m_base.size < (int)uVar10) {
              __assert_fail("m_faceCharts[i] <= int32_t(m_charts.size())",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                            ,0x15ed,"void xatlas::internal::segment::ClusteredCharts::mergeCharts()"
                           );
            }
            if ((int)index < (int)uVar10) {
              *(uint *)(puVar5 + uVar13 * 4) = uVar10 - 1;
            }
            uVar13 = uVar13 + 1;
          } while (uVar14 != uVar13);
        }
      }
      else {
        *puVar6 = index;
        index = index + 1;
      }
      uVar10 = (this->m_charts).m_base.size;
    } while ((int)index < (int)uVar10);
  }
  return;
LAB_0011eb34:
  pcVar12 = "T &xatlas::internal::Array<float>::operator[](uint32_t) [T = float]";
  goto LAB_0011ebf5;
LAB_0011eb4e:
  pcVar12 = "T &xatlas::internal::Array<float>::operator[](uint32_t) [T = float]";
  goto LAB_0011ebd6;
LAB_0011ebe0:
  pcVar12 = "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
  goto LAB_0011ebf5;
LAB_0011ebc1:
  pcVar12 = "T &xatlas::internal::Array<unsigned int>::operator[](uint32_t) [T = unsigned int]";
  goto LAB_0011ebd6;
LAB_0011eb93:
  pcVar12 = 
  "T &xatlas::internal::Array<xatlas::internal::segment::ClusteredCharts::Chart *>::operator[](uint32_t) [T = xatlas::internal::segment::ClusteredCharts::Chart *]"
  ;
  goto LAB_0011ebf5;
LAB_0011ebaa:
  pcVar12 = 
  "T &xatlas::internal::Array<xatlas::internal::segment::ClusteredCharts::Chart *>::operator[](uint32_t) [T = xatlas::internal::segment::ClusteredCharts::Chart *]"
  ;
  goto LAB_0011ebd6;
LAB_0011eb65:
  pcVar12 = "T &xatlas::internal::Array<int>::operator[](uint32_t) [T = int]";
LAB_0011ebf5:
  __assert_fail("index < m_base.size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x47f,pcVar12);
LAB_0011eb7c:
  pcVar12 = "T &xatlas::internal::Array<int>::operator[](uint32_t) [T = int]";
LAB_0011ebd6:
  __assert_fail("m_base.buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_25/vicfergar[P]XAtlasSharp/src/XAtlas/xatlas.cpp"
                ,0x480,pcVar12);
}

Assistant:

void mergeCharts()
	{
		XA_PROFILE_START(clusteredChartsMerge)
		const uint32_t chartCount = m_charts.size();
		// Merge charts progressively until there's none left to merge.
		for (;;) {
			bool merged = false;
			for (int c = chartCount - 1; c >= 0; c--) {
				Chart *chart = m_charts[c];
				if (chart == nullptr)
					continue;
				float externalBoundaryLength = 0.0f;
				m_sharedBoundaryLengths.resize(chartCount);
				m_sharedBoundaryLengths.zeroOutMemory();
				m_sharedBoundaryLengthsNoSeams.resize(chartCount);
				m_sharedBoundaryLengthsNoSeams.zeroOutMemory();
				m_sharedBoundaryEdgeCountNoSeams.resize(chartCount);
				m_sharedBoundaryEdgeCountNoSeams.zeroOutMemory();
				const uint32_t faceCount = chart->faces.size();
				for (uint32_t i = 0; i < faceCount; i++) {
					const uint32_t f = chart->faces[i];
					for (Mesh::FaceEdgeIterator it(m_data.mesh, f); !it.isDone(); it.advance()) {
						const float l = m_data.edgeLengths[it.edge()];
						if (it.isBoundary()) {
							externalBoundaryLength += l;
						} else {
							const int neighborChart = m_faceCharts[it.oppositeFace()];
							if (neighborChart == -1)
								externalBoundaryLength += l;
							else if (m_charts[neighborChart] != chart) {
								if ((it.isSeam() && (isNormalSeam(it.edge()) || it.isTextureSeam()))) {
									externalBoundaryLength += l;
								} else {
									m_sharedBoundaryLengths[neighborChart] += l;
								}
								m_sharedBoundaryLengthsNoSeams[neighborChart] += l;
								m_sharedBoundaryEdgeCountNoSeams[neighborChart]++;
							}
						}
					}
				}
				for (int cc = chartCount - 1; cc >= 0; cc--) {
					if (cc == c)
						continue;
					Chart *chart2 = m_charts[cc];
					if (chart2 == nullptr)
						continue;
					// Must share a boundary.
					if (m_sharedBoundaryLengths[cc] <= 0.0f)
						continue;
					// Compare proxies.
					if (dot(chart2->basis.normal, chart->basis.normal) < XA_MERGE_CHARTS_MIN_NORMAL_DEVIATION)
						continue;
					// Obey max chart area and boundary length.
					if (m_data.options.maxChartArea > 0.0f && chart->area + chart2->area > m_data.options.maxChartArea)
						continue;
					if (m_data.options.maxBoundaryLength > 0.0f && chart->boundaryLength + chart2->boundaryLength - m_sharedBoundaryLengthsNoSeams[cc] > m_data.options.maxBoundaryLength)
						continue;
					// Merge if chart2 has a single face.
					// chart1 must have more than 1 face.
					// chart2 area must be <= 10% of chart1 area.
					if (m_sharedBoundaryLengthsNoSeams[cc] > 0.0f && chart->faces.size() > 1 && chart2->faces.size() == 1 && chart2->area <= chart->area * 0.1f)
						goto merge;
					// Merge if chart2 has two faces (probably a quad), and chart1 bounds at least 2 of its edges.
					if (chart2->faces.size() == 2 && m_sharedBoundaryEdgeCountNoSeams[cc] >= 2)
						goto merge;
					// Merge if chart2 is wholely inside chart1, ignoring seams.
					if (m_sharedBoundaryLengthsNoSeams[cc] > 0.0f && equal(m_sharedBoundaryLengthsNoSeams[cc], chart2->boundaryLength, kEpsilon))
						goto merge;
					if (m_sharedBoundaryLengths[cc] > 0.2f * max(0.0f, chart->boundaryLength - externalBoundaryLength) ||
						m_sharedBoundaryLengths[cc] > 0.75f * chart2->boundaryLength)
						goto merge;
					continue;
				merge:
					if (!mergeChart(chart, chart2, m_sharedBoundaryLengthsNoSeams[cc]))
						continue;
					merged = true;
					break;
				}
				if (merged)
					break;
			}
			if (!merged)
				break;
		}
		// Remove deleted charts.
		for (int c = 0; c < int32_t(m_charts.size()); /*do not increment if removed*/) {
			if (m_charts[c] == nullptr) {
				m_charts.removeAt(c);
				// Update m_faceCharts.
				const uint32_t faceCount = m_faceCharts.size();
				for (uint32_t i = 0; i < faceCount; i++) {
					XA_DEBUG_ASSERT(m_faceCharts[i] != c);
					XA_DEBUG_ASSERT(m_faceCharts[i] <= int32_t(m_charts.size()));
					if (m_faceCharts[i] > c) {
						m_faceCharts[i]--;
					}
				}
			} else {
				m_charts[c]->id = c;
				c++;
			}
		}
		XA_PROFILE_END(clusteredChartsMerge)
	}